

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_round_to_flat_curves
          (SceneGraph *this,Ref<embree::SceneGraph::Node> *node)

{
  int iVar1;
  Node *pNVar2;
  long lVar3;
  long *plVar4;
  undefined4 uVar5;
  long *plVar6;
  ulong uVar7;
  long local_58;
  Ref<embree::SceneGraph::Node> local_50;
  Ref<embree::SceneGraph::Node> local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Node *local_38;
  
  pNVar2 = node->ptr;
  if (pNVar2 == (Node *)0x0) {
LAB_00148906:
    (((Node *)this)->super_RefCount)._vptr_RefCount = (_func_int **)node->ptr;
    node->ptr = (Node *)0x0;
    return (Ref<embree::SceneGraph::Node>)(Node *)this;
  }
  plVar6 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&TransformNode::typeinfo,0);
  if (plVar6 != (long *)0x0) {
    (**(code **)(*plVar6 + 0x10))(plVar6);
    local_40.ptr = (Node *)plVar6[0x13];
    if (local_40.ptr != (Node *)0x0) {
      (*((local_40.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    convert_round_to_flat_curves((SceneGraph *)&local_58,&local_40);
    if ((long *)plVar6[0x13] != (long *)0x0) {
      (**(code **)(*(long *)plVar6[0x13] + 0x18))();
    }
    plVar6[0x13] = local_58;
    if (local_40.ptr != (Node *)0x0) {
      (*((local_40.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    (**(code **)(*plVar6 + 0x18))(plVar6);
    goto LAB_00148906;
  }
  plVar6 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
  if (plVar6 != (long *)0x0) {
    (**(code **)(*plVar6 + 0x10))(plVar6);
    local_48.ptr = (Node *)plVar6[0x10];
    if (local_48.ptr != (Node *)0x0) {
      (*((local_48.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    convert_round_to_flat_curves((SceneGraph *)&local_58,&local_48);
    if ((long *)plVar6[0x10] != (long *)0x0) {
      (**(code **)(*(long *)plVar6[0x10] + 0x18))();
    }
    plVar6[0x10] = local_58;
    if (local_48.ptr != (Node *)0x0) {
      (*((local_48.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    (**(code **)(*plVar6 + 0x18))(plVar6);
    goto LAB_00148906;
  }
  plVar6 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&GroupNode::typeinfo,0);
  if (plVar6 != (long *)0x0) {
    local_38 = (Node *)this;
    (**(code **)(*plVar6 + 0x10))(plVar6);
    for (uVar7 = 0; uVar7 < (ulong)(plVar6[0xe] - plVar6[0xd] >> 3); uVar7 = uVar7 + 1) {
      local_50.ptr = *(Node **)(plVar6[0xd] + uVar7 * 8);
      if (local_50.ptr != (Node *)0x0) {
        (*((local_50.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      convert_round_to_flat_curves((SceneGraph *)&local_58,&local_50);
      lVar3 = plVar6[0xd];
      plVar4 = *(long **)(lVar3 + uVar7 * 8);
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 0x18))();
      }
      *(long *)(lVar3 + uVar7 * 8) = local_58;
      if (local_50.ptr != (Node *)0x0) {
        (*((local_50.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
    }
    (**(code **)(*plVar6 + 0x18))(plVar6);
    this = (SceneGraph *)local_38;
    goto LAB_00148906;
  }
  plVar6 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&HairSetNode::typeinfo,0);
  if (plVar6 == (long *)0x0) goto LAB_00148906;
  (**(code **)(*plVar6 + 0x10))(plVar6);
  iVar1 = (int)plVar6[0xe];
  if (iVar1 == 0x10) {
    uVar5 = 0x11;
  }
  else if (iVar1 == 0x18) {
    uVar5 = 0x19;
  }
  else {
    if (iVar1 != 0x20) goto LAB_0014896d;
    uVar5 = 0x21;
  }
  *(undefined4 *)(plVar6 + 0xe) = uVar5;
LAB_0014896d:
  *(long **)this = plVar6;
  (**(code **)(*plVar6 + 0x10))(plVar6);
  (**(code **)(*plVar6 + 0x18))(plVar6);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_round_to_flat_curves(Ref<SceneGraph::Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = convert_round_to_flat_curves(xfmNode->child);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = convert_round_to_flat_curves(xfmNode->child);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = convert_round_to_flat_curves(groupNode->children[i]);
    }
    else if (Ref<SceneGraph::HairSetNode> hmesh = node.dynamicCast<SceneGraph::HairSetNode>()) 
    {
      if (hmesh->type == RTC_GEOMETRY_TYPE_ROUND_LINEAR_CURVE)
        hmesh->type = RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE;
      else if (hmesh->type == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE)
        hmesh->type = RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE;
      else if (hmesh->type == RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE)
        hmesh->type = RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE;

      return hmesh.dynamicCast<SceneGraph::Node>();
    }
    return node;
  }